

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O0

void iDynTree::assertSpatialMotionAreEqual
               (SpatialMotionVector *f1,SpatialMotionVector *f2,double tol,string *file,int line)

{
  string *in_RDX;
  Vector6 f2plain;
  Vector6 f1plain;
  undefined4 in_stack_000000c0;
  string local_a8 [8];
  SpatialVector<iDynTree::SpatialMotionVector> *in_stack_ffffffffffffff60;
  
  SpatialVector<iDynTree::SpatialMotionVector>::asVector(in_stack_ffffffffffffff60);
  SpatialVector<iDynTree::SpatialMotionVector>::asVector(in_stack_ffffffffffffff60);
  std::__cxx11::string::string(local_a8,in_RDX);
  assertVectorAreEqual<iDynTree::VectorFixSize<6u>,iDynTree::VectorFixSize<6u>>
            ((VectorFixSize<6U> *)tol,(VectorFixSize<6U> *)file,
             (double)CONCAT44(line,in_stack_000000c0),(string *)f1plain.m_data[5],
             f1plain.m_data[4]._4_4_);
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

void assertSpatialMotionAreEqual(const SpatialMotionVector& f1, const SpatialMotionVector& f2, double tol, std::string file, int line)
{
    Vector6 f1plain = f1.asVector();
    Vector6 f2plain = f2.asVector();
    assertVectorAreEqual(f1plain,f2plain,tol,file,line);
}